

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O2

void __thiscall TextReader::parse_bin(TextReader *this)

{
  byte bVar1;
  ulong uVar2;
  pointer pcVar3;
  size_t sVar4;
  string *this_00;
  allocator local_49;
  string local_48;
  string local_28;
  
  sVar4 = this->current_token_len_ + 2;
  uVar2 = (this->current_line_)._M_string_length;
  pcVar3 = (this->current_line_)._M_dataplus._M_p;
  do {
    this->current_token_len_ = sVar4;
    if (uVar2 <= this->current_token_pos_ + sVar4) {
LAB_0010c044:
      if (sVar4 == 2) {
        std::__cxx11::string::string
                  ((string *)&local_48,"Binary value prefix specified without the value",&local_49);
        parse_error(this,&local_48);
        this_00 = &local_48;
LAB_0010c072:
        std::__cxx11::string::~string((string *)this_00);
      }
      return;
    }
    bVar1 = pcVar3[sVar4 + this->current_token_pos_];
    if ((bVar1 & 0xfe) != 0x30) {
      if ((char)bVar1 < '0') goto LAB_0010c044;
      if (0x39 < bVar1) {
        if (bVar1 < 0x41) goto LAB_0010c044;
        if (0x5a < bVar1) {
          if (bVar1 < 0x61) {
            if (bVar1 != 0x5f) goto LAB_0010c044;
          }
          else if (0x7a < bVar1) goto LAB_0010c044;
        }
      }
      std::__cxx11::string::string((string *)&local_28,"Invalid symbol in binary value",&local_49);
      parse_error(this,&local_28);
      this_00 = &local_28;
      goto LAB_0010c072;
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

inline void parse_bin() {
        current_token_len_++;
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
               _is_bin_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            _is_literal_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            parse_error(ERROR_BIN_INVALID_SYMBOL);
        } else if (current_token_len_ == 2) {
            parse_error(ERROR_MISSING_BIN_VALUE);
        };
    }